

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O2

void __thiscall
llvm::DWARFDebugLine::LineTable::dump(LineTable *this,raw_ostream *OS,DIDumpOptions DumpOptions)

{
  pointer pRVar1;
  Row *R;
  pointer this_00;
  
  Prologue::dump(&this->Prologue,OS,DumpOptions);
  raw_ostream::operator<<(OS,'\n');
  if ((this->Rows).
      super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->Rows).
      super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    Row::dumpTableHeader(OS);
    pRVar1 = (this->Rows).
             super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (this->Rows).
                   super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pRVar1;
        this_00 = this_00 + 1) {
      Row::dump(this_00,OS);
    }
  }
  return;
}

Assistant:

void DWARFDebugLine::LineTable::dump(raw_ostream &OS,
                                     DIDumpOptions DumpOptions) const {
  Prologue.dump(OS, DumpOptions);
  OS << '\n';

  if (!Rows.empty()) {
    Row::dumpTableHeader(OS);
    for (const Row &R : Rows) {
      R.dump(OS);
    }
  }
}